

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

void __thiscall
glu::sl::ShaderParser::parseExpectResult(ShaderParser *this,ExpectResult *expectResult)

{
  string *__lhs;
  bool bVar1;
  undefined8 extraout_RAX;
  ExpectResult EStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  assumeToken(this,TOKEN_IDENTIFIER);
  __lhs = &this->m_curTokenStr;
  bVar1 = std::operator==(__lhs,"pass");
  EStack_40 = EXPECT_PASS;
  if (!bVar1) {
    bVar1 = std::operator==(__lhs,"compile_fail");
    if (bVar1) {
      EStack_40 = EXPECT_COMPILE_FAIL;
    }
    else {
      bVar1 = std::operator==(__lhs,"link_fail");
      if (bVar1) {
        EStack_40 = EXPECT_LINK_FAIL;
      }
      else {
        bVar1 = std::operator==(__lhs,"compile_or_link_fail");
        if (bVar1) {
          EStack_40 = EXPECT_COMPILE_LINK_FAIL;
        }
        else {
          bVar1 = std::operator==(__lhs,"validation_fail");
          if (bVar1) {
            EStack_40 = EXPECT_VALIDATION_FAIL;
          }
          else {
            bVar1 = std::operator==(__lhs,"build_successful");
            if (!bVar1) {
              std::operator+(&bStack_38,"invalid expected result value: ",__lhs);
              parseError(this,&bStack_38);
              std::__cxx11::string::~string((string *)&bStack_38);
              _Unwind_Resume(extraout_RAX);
            }
            EStack_40 = EXPECT_BUILD_SUCCESSFUL;
          }
        }
      }
    }
  }
  *expectResult = EStack_40;
  advanceToken(this);
  return;
}

Assistant:

void ShaderParser::parseExpectResult (ExpectResult& expectResult)
{
	assumeToken(TOKEN_IDENTIFIER);

	if (m_curTokenStr == "pass")
		expectResult = EXPECT_PASS;
	else if (m_curTokenStr == "compile_fail")
		expectResult = EXPECT_COMPILE_FAIL;
	else if (m_curTokenStr == "link_fail")
		expectResult = EXPECT_LINK_FAIL;
	else if (m_curTokenStr == "compile_or_link_fail")
		expectResult = EXPECT_COMPILE_LINK_FAIL;
	else if (m_curTokenStr == "validation_fail")
		expectResult = EXPECT_VALIDATION_FAIL;
	else if (m_curTokenStr == "build_successful")
		expectResult = EXPECT_BUILD_SUCCESSFUL;
	else
		parseError(string("invalid expected result value: " + m_curTokenStr));

	advanceToken();
}